

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O0

int32_t __thiscall
icu_63::Normalizer2WithImpl::spanQuickCheckYes
          (Normalizer2WithImpl *this,UnicodeString *s,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  char16_t *pcVar4;
  undefined4 extraout_var;
  UChar *sArray;
  UErrorCode *errorCode_local;
  UnicodeString *s_local;
  Normalizer2WithImpl *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    pcVar4 = UnicodeString::getBuffer(s);
    if (pcVar4 == (char16_t *)0x0) {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
    else {
      iVar2 = UnicodeString::length(s);
      iVar3 = (*(this->super_Normalizer2).super_UObject._vptr_UObject[0x14])
                        (this,pcVar4,pcVar4 + iVar2,errorCode);
      this_local._4_4_ = (int32_t)(CONCAT44(extraout_var,iVar3) - (long)pcVar4 >> 1);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

virtual int32_t
    spanQuickCheckYes(const UnicodeString &s, UErrorCode &errorCode) const {
        if(U_FAILURE(errorCode)) {
            return 0;
        }
        const UChar *sArray=s.getBuffer();
        if(sArray==NULL) {
            errorCode=U_ILLEGAL_ARGUMENT_ERROR;
            return 0;
        }
        return (int32_t)(spanQuickCheckYes(sArray, sArray+s.length(), errorCode)-sArray);
    }